

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::TZGNCore::formatGenericNonLocationName
          (TZGNCore *this,TimeZone *tz,UTimeZoneGenericNameType type,UDate date,UnicodeString *name)

{
  undefined8 uVar1;
  char cVar2;
  int8_t iVar3;
  UBool UVar4;
  int iVar5;
  int32_t iVar6;
  undefined4 extraout_var;
  long lVar8;
  TimeZoneRule *pTVar9;
  TimeZone *pTVar10;
  undefined8 uVar11;
  bool bVar12;
  UDate UVar13;
  int32_t sav;
  UErrorCode status;
  UDate local_3a8;
  int32_t raw;
  int32_t sav1;
  int32_t raw1;
  ConstChar16Ptr local_390;
  UChar *local_388;
  TimeZoneTransition after;
  UnicodeString mzGenericName;
  UnicodeString mzID;
  UnicodeString tzID;
  TimeZoneTransition before;
  UChar mzIDBuf [32];
  UChar tmpNameBuf [128];
  long *plVar7;
  
  local_3a8 = date;
  UnicodeString::setToBogus(name);
  local_390.p_ = ZoneMeta::getCanonicalCLDRID(tz);
  if (local_390.p_ == (UChar *)0x0) {
    return name;
  }
  UnicodeString::UnicodeString(&tzID,'\x01',&local_390,-1);
  local_388 = local_390.p_;
  uVar1 = 8;
  if (type == UTZGNM_LONG) {
    uVar1 = 1;
  }
  (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[10])(this->fTimeZoneNames,&tzID,uVar1,name);
  if (0x1f < (ushort)(name->fUnion).fStackFields.fLengthAndFlags) goto LAB_002001f2;
  UnicodeString::UnicodeString(&mzID,mzIDBuf,0,0x20);
  (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[7])
            (local_3a8,this->fTimeZoneNames,&tzID,&mzID);
  if (0x1f < (ushort)mzID.fUnion.fStackFields.fLengthAndFlags) {
    status = U_ZERO_ERROR;
    (*(tz->super_UObject)._vptr_UObject[6])(local_3a8,tz,0,&raw,&sav);
    if (status < U_ILLEGAL_ARGUMENT_ERROR) {
      if (sav == 0) {
        iVar5 = (*(tz->super_UObject)._vptr_UObject[0xc])(tz);
        plVar7 = (long *)CONCAT44(extraout_var,iVar5);
        if ((plVar7 == (long *)0x0) ||
           ((((lVar8 = __dynamic_cast(plVar7,&TimeZone::typeinfo,&OlsonTimeZone::typeinfo,0),
              lVar8 == 0 &&
              (lVar8 = __dynamic_cast(plVar7,&TimeZone::typeinfo,&SimpleTimeZone::typeinfo,0),
              lVar8 == 0)) &&
             (lVar8 = __dynamic_cast(plVar7,&TimeZone::typeinfo,&RuleBasedTimeZone::typeinfo,0),
             lVar8 == 0)) &&
            (lVar8 = __dynamic_cast(plVar7,&TimeZone::typeinfo,&VTimeZone::typeinfo,0), lVar8 == 0))
           )) {
          (**(code **)(*plVar7 + 0x30))(local_3a8 + -15897600000.0,plVar7,0,&raw,&sav,&status);
          if (sav == 0) {
            (**(code **)(*plVar7 + 0x30))(local_3a8 + 15897600000.0,plVar7,0,&raw,&sav,&status);
            bVar12 = sav == 0;
          }
          else {
            bVar12 = false;
          }
          if (U_ZERO_ERROR < status) {
            (**(code **)(*plVar7 + 8))(plVar7);
            goto LAB_002001e5;
          }
        }
        else {
          TimeZoneTransition::TimeZoneTransition(&before);
          cVar2 = (**(code **)(*plVar7 + 0x78))(local_3a8,plVar7,1,&before);
          if ((cVar2 == '\0') ||
             (UVar13 = TimeZoneTransition::getTime(&before), 15897600000.0 <= local_3a8 - UVar13)) {
LAB_001fff31:
            TimeZoneTransition::TimeZoneTransition(&after);
            cVar2 = (**(code **)(*plVar7 + 0x70))(local_3a8,plVar7,0,&after);
            bVar12 = true;
            if ((cVar2 != '\0') &&
               (UVar13 = TimeZoneTransition::getTime(&after), UVar13 - local_3a8 < 15897600000.0)) {
              pTVar9 = TimeZoneTransition::getTo(&after);
              iVar6 = TimeZoneRule::getDSTSavings(pTVar9);
              bVar12 = iVar6 == 0;
            }
            TimeZoneTransition::~TimeZoneTransition(&after);
          }
          else {
            pTVar9 = TimeZoneTransition::getFrom(&before);
            iVar6 = TimeZoneRule::getDSTSavings(pTVar9);
            if (iVar6 == 0) goto LAB_001fff31;
            bVar12 = false;
          }
          TimeZoneTransition::~TimeZoneTransition(&before);
        }
        (**(code **)(*plVar7 + 8))(plVar7);
        if (bVar12) {
          UnicodeString::UnicodeString((UnicodeString *)&after,tmpNameBuf,0,0x80);
          uVar11 = 0x10;
          if (type == UTZGNM_LONG) {
            uVar11 = 2;
          }
          (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[0xc])
                    (local_3a8,this->fTimeZoneNames,&tzID,uVar11,&after);
          if (0x1f < after.fTime._0_2_) {
            UnicodeString::setTo(name,(UnicodeString *)&after);
            UnicodeString::UnicodeString(&mzGenericName,(UChar *)&before,0,0x80);
            (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[9])
                      (this->fTimeZoneNames,&mzID,uVar1,&mzGenericName);
            iVar3 = UnicodeString::caseCompare((UnicodeString *)&after,&mzGenericName,0);
            if (iVar3 == '\0') {
              UnicodeString::setToBogus(name);
            }
            UnicodeString::~UnicodeString(&mzGenericName);
          }
          UnicodeString::~UnicodeString((UnicodeString *)&after);
        }
      }
      if ((ushort)(name->fUnion).fStackFields.fLengthAndFlags < 0x20) {
        UnicodeString::UnicodeString((UnicodeString *)&before,tmpNameBuf,0,0x80);
        (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[9])
                  (this->fTimeZoneNames,&mzID,uVar1,&before);
        if (0x1f < before.fTime._0_2_) {
          UnicodeString::UnicodeString(&mzGenericName,(UChar *)&after,0,0x20);
          (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[8])
                    (this->fTimeZoneNames,&mzID,this->fTargetRegion,&mzGenericName);
          if (((ushort)mzGenericName.fUnion.fStackFields.fLengthAndFlags < 0x20) ||
             (UVar4 = UnicodeString::operator!=(&mzGenericName,&tzID), UVar4 == '\0')) {
            UnicodeString::setTo(name,(UnicodeString *)&before);
          }
          else {
            pTVar10 = TimeZone::createTimeZone(&mzGenericName);
            (*(pTVar10->super_UObject)._vptr_UObject[6])
                      ((double)sav + (double)raw + local_3a8,pTVar10,1,&raw1,&sav1,&status);
            (*(pTVar10->super_UObject)._vptr_UObject[1])(pTVar10);
            if (status < U_ILLEGAL_ARGUMENT_ERROR) {
              if ((raw == raw1) && (sav == sav1)) {
                UnicodeString::setTo(name,(UnicodeString *)&before);
              }
              else {
                getPartialLocationName
                          (this,&tzID,&mzID,type == UTZGNM_LONG,(UnicodeString *)&before,name);
              }
            }
          }
          UnicodeString::~UnicodeString(&mzGenericName);
        }
        UnicodeString::~UnicodeString((UnicodeString *)&before);
      }
    }
  }
LAB_002001e5:
  UnicodeString::~UnicodeString(&mzID);
LAB_002001f2:
  UnicodeString::~UnicodeString(&tzID);
  return name;
}

Assistant:

UnicodeString&
TZGNCore::formatGenericNonLocationName(const TimeZone& tz, UTimeZoneGenericNameType type, UDate date, UnicodeString& name) const {
    U_ASSERT(type == UTZGNM_LONG || type == UTZGNM_SHORT);
    name.setToBogus();

    const UChar* uID = ZoneMeta::getCanonicalCLDRID(tz);
    if (uID == NULL) {
        return name;
    }

    UnicodeString tzID(TRUE, uID, -1);

    // Try to get a name from time zone first
    UTimeZoneNameType nameType = (type == UTZGNM_LONG) ? UTZNM_LONG_GENERIC : UTZNM_SHORT_GENERIC;
    fTimeZoneNames->getTimeZoneDisplayName(tzID, nameType, name);

    if (!name.isEmpty()) {
        return name;
    }

    // Try meta zone
    UChar mzIDBuf[32];
    UnicodeString mzID(mzIDBuf, 0, UPRV_LENGTHOF(mzIDBuf));
    fTimeZoneNames->getMetaZoneID(tzID, date, mzID);
    if (!mzID.isEmpty()) {
        UErrorCode status = U_ZERO_ERROR;
        UBool useStandard = FALSE;
        int32_t raw, sav;
        UChar tmpNameBuf[ZONE_NAME_U16_MAX];

        tz.getOffset(date, FALSE, raw, sav, status);
        if (U_FAILURE(status)) {
            return name;
        }

        if (sav == 0) {
            useStandard = TRUE;

            TimeZone *tmptz = tz.clone();
            // Check if the zone actually uses daylight saving time around the time
            BasicTimeZone *btz = NULL;
            if (dynamic_cast<OlsonTimeZone *>(tmptz) != NULL
                || dynamic_cast<SimpleTimeZone *>(tmptz) != NULL
                || dynamic_cast<RuleBasedTimeZone *>(tmptz) != NULL
                || dynamic_cast<VTimeZone *>(tmptz) != NULL) {
                btz = (BasicTimeZone*)tmptz;
            }

            if (btz != NULL) {
                TimeZoneTransition before;
                UBool beforTrs = btz->getPreviousTransition(date, TRUE, before);
                if (beforTrs
                        && (date - before.getTime() < kDstCheckRange)
                        && before.getFrom()->getDSTSavings() != 0) {
                    useStandard = FALSE;
                } else {
                    TimeZoneTransition after;
                    UBool afterTrs = btz->getNextTransition(date, FALSE, after);
                    if (afterTrs
                            && (after.getTime() - date < kDstCheckRange)
                            && after.getTo()->getDSTSavings() != 0) {
                        useStandard = FALSE;
                    }
                }
            } else {
                // If not BasicTimeZone... only if the instance is not an ICU's implementation.
                // We may get a wrong answer in edge case, but it should practically work OK.
                tmptz->getOffset(date - kDstCheckRange, FALSE, raw, sav, status);
                if (sav != 0) {
                    useStandard = FALSE;
                } else {
                    tmptz->getOffset(date + kDstCheckRange, FALSE, raw, sav, status);
                    if (sav != 0){
                        useStandard = FALSE;
                    }
                }
                if (U_FAILURE(status)) {
                    delete tmptz;
                    return name;
                }
            }
            delete tmptz;
        }
        if (useStandard) {
            UTimeZoneNameType stdNameType = (nameType == UTZNM_LONG_GENERIC)
                ? UTZNM_LONG_STANDARD : UTZNM_SHORT_STANDARD;
            UnicodeString stdName(tmpNameBuf, 0, UPRV_LENGTHOF(tmpNameBuf));
            fTimeZoneNames->getDisplayName(tzID, stdNameType, date, stdName);
            if (!stdName.isEmpty()) {
                name.setTo(stdName);

                // TODO: revisit this issue later
                // In CLDR, a same display name is used for both generic and standard
                // for some meta zones in some locales.  This looks like a data bugs.
                // For now, we check if the standard name is different from its generic
                // name below.
                UChar genNameBuf[ZONE_NAME_U16_MAX];
                UnicodeString mzGenericName(genNameBuf, 0, UPRV_LENGTHOF(genNameBuf));
                fTimeZoneNames->getMetaZoneDisplayName(mzID, nameType, mzGenericName);
                if (stdName.caseCompare(mzGenericName, 0) == 0) {
                    name.setToBogus();
                }
            }
        }
        if (name.isEmpty()) {
            // Get a name from meta zone
            UnicodeString mzName(tmpNameBuf, 0, UPRV_LENGTHOF(tmpNameBuf));
            fTimeZoneNames->getMetaZoneDisplayName(mzID, nameType, mzName);
            if (!mzName.isEmpty()) {
                // Check if we need to use a partial location format.
                // This check is done by comparing offset with the meta zone's
                // golden zone at the given date.
                UChar idBuf[32];
                UnicodeString goldenID(idBuf, 0, UPRV_LENGTHOF(idBuf));
                fTimeZoneNames->getReferenceZoneID(mzID, fTargetRegion, goldenID);
                if (!goldenID.isEmpty() && goldenID != tzID) {
                    TimeZone *goldenZone = TimeZone::createTimeZone(goldenID);
                    int32_t raw1, sav1;

                    // Check offset in the golden zone with wall time.
                    // With getOffset(date, false, offsets1),
                    // you may get incorrect results because of time overlap at DST->STD
                    // transition.
                    goldenZone->getOffset(date + raw + sav, TRUE, raw1, sav1, status);
                    delete goldenZone;
                    if (U_SUCCESS(status)) {
                        if (raw != raw1 || sav != sav1) {
                            // Now we need to use a partial location format
                            getPartialLocationName(tzID, mzID, (nameType == UTZNM_LONG_GENERIC), mzName, name);
                        } else {
                            name.setTo(mzName);
                        }
                    }
                } else {
                    name.setTo(mzName);
                }
            }
        }
    }
    return name;
}